

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlparser.cpp
# Opt level: O2

void UrlParserTest::http_url_with_port_invoker(void)

{
  undefined8 uVar1;
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> local_210;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_70 = "";
  memset(&local_210,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_210);
  std::operator<<((ostream *)&local_210,'\"');
  std::operator<<((ostream *)&local_210,"http_url_with_port");
  std::operator<<((ostream *)&local_210,"\" fixture ctor");
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_210);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_78,0x44);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_210);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_60 = "";
  memset(&local_210,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_210);
  std::operator<<((ostream *)&local_210,'\"');
  std::operator<<((ostream *)&local_210,"http_url_with_port");
  std::operator<<((ostream *)&local_210,"\" fixture setup");
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_210);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_68,0x44);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_210);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_50 = "";
  memset(&local_210,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_210);
  std::operator<<((ostream *)&local_210,'\"');
  std::operator<<((ostream *)&local_210,"http_url_with_port");
  std::operator<<((ostream *)&local_210,"\" test entry");
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_210);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_58,0x44);
  this = &local_210;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  http_url_with_port::test_method((http_url_with_port *)this);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_40 = "";
  memset(&local_210,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_210);
  std::operator<<((ostream *)&local_210,'\"');
  std::operator<<((ostream *)&local_210,"http_url_with_port");
  std::operator<<((ostream *)&local_210,"\" fixture teardown");
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_210);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_48,0x44);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_210);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_30 = "";
  memset(&local_210,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_210);
  std::operator<<((ostream *)&local_210,'\"');
  std::operator<<((ostream *)&local_210,"http_url_with_port");
  std::operator<<((ostream *)&local_210,"\" fixture dtor");
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_210);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_38,0x44);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_210);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(http_url_with_port)
{
    const char *text = "http://www.example.com:8080/dir/subdir?param=1&param=2;param%20=%20#fragment";
    UrlParser parser(text);

    BOOST_CHECK_EQUAL(parser.isValid(), true);
    BOOST_CHECK_EQUAL(parser.scheme(), "http");
    BOOST_CHECK_EQUAL(parser.hostname(), "www.example.com");
    BOOST_CHECK_EQUAL(parser.path(), "/dir/subdir");
    BOOST_CHECK_EQUAL(parser.query(), "param=1&param=2;param%20=%20");
    BOOST_CHECK_EQUAL(parser.fragment(), "fragment");
    BOOST_CHECK_EQUAL(parser.httpPort(), 8080);
}